

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void deqp::gls::LifetimeTests::details::addTestCases(TestCaseGroup *group,Types *types)

{
  TestContext *testCtx;
  _Alloc_hider node;
  int iVar1;
  TestNode *pTVar2;
  LifeTest *this;
  undefined4 extraout_var;
  TestNode *pTVar3;
  AttachmentTest *this_00;
  InputAttachmentTest *this_01;
  OutputAttachmentTest *this_02;
  Attacher *extraout_RDX;
  Attacher *extraout_RDX_00;
  Attacher *extraout_RDX_01;
  Attacher *extraout_RDX_02;
  Attacher *extraout_RDX_03;
  Attacher *pAVar4;
  Attacher *extraout_RDX_04;
  pointer ppOVar5;
  long lVar6;
  pointer ppAVar7;
  pointer ppIVar8;
  string name;
  
  testCtx = (types->super_ContextWrapper).m_ctx.m_testCtx;
  for (lVar6 = 0; lVar6 != 0xa0; lVar6 = lVar6 + 0x20) {
    createLifeTestGroup((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        &name,testCtx,(LifeTestSpec *)(s_lifeTests + lVar6),&types->m_types);
    node = name._M_dataplus;
    name._M_dataplus._M_p = (pointer)0x0;
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)node._M_p);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&name);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"delete_used","Delete current program");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  this = (LifeTest *)operator_new(0xc0);
  iVar1 = (**types->_vptr_Types)(types);
  LifeTest::LifeTest(this,"program","program",(Type *)CONCAT44(extraout_var,iVar1),0x14b5d7a);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,"attach","Attachment tests");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,testCtx,"deleted_name","Name of deleted attachment");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pAVar4 = extraout_RDX;
  for (ppAVar7 = (types->m_attachers).
                 super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar7 !=
      (types->m_attachers).
      super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar7 = ppAVar7 + 1) {
    attacherName_abi_cxx11_(&name,(details *)*ppAVar7,pAVar4);
    this_00 = (AttachmentTest *)operator_new(0xc0);
    AttachmentTest::AttachmentTest
              (this_00,name._M_dataplus._M_p,name._M_dataplus._M_p,*ppAVar7,0x14b621a);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&name);
    pAVar4 = extraout_RDX_00;
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,testCtx,"deleted_input","Input from deleted attachment");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pAVar4 = extraout_RDX_01;
  for (ppIVar8 = (types->m_inAttachers).
                 super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar8 !=
      (types->m_inAttachers).
      super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppIVar8 = ppIVar8 + 1) {
    attacherName_abi_cxx11_(&name,(details *)(*ppIVar8)->m_attacher,pAVar4);
    this_01 = (InputAttachmentTest *)operator_new(0xb0);
    InputAttachmentTest::InputAttachmentTest
              (this_01,name._M_dataplus._M_p,name._M_dataplus._M_p,*ppIVar8);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&name);
    pAVar4 = extraout_RDX_02;
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,testCtx,"deleted_output","Output to deleted attachment");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pAVar4 = extraout_RDX_03;
  for (ppOVar5 = (types->m_outAttachers).
                 super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppOVar5 !=
      (types->m_outAttachers).
      super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppOVar5 = ppOVar5 + 1) {
    attacherName_abi_cxx11_(&name,(details *)(*ppOVar5)->m_attacher,pAVar4);
    this_02 = (OutputAttachmentTest *)operator_new(0xb0);
    OutputAttachmentTest::OutputAttachmentTest
              (this_02,name._M_dataplus._M_p,name._M_dataplus._M_p,*ppOVar5);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&name);
    pAVar4 = extraout_RDX_04;
  }
  return;
}

Assistant:

void addTestCases (TestCaseGroup& group, Types& types)
{
	TestContext& testCtx = types.getTestContext();

	for (const LifeTestSpec* it = DE_ARRAY_BEGIN(s_lifeTests);
		 it != DE_ARRAY_END(s_lifeTests); ++it)
		group.addChild(createLifeTestGroup(testCtx, *it, types.getTypes()).release());

	{
		TestCaseGroup* const delUsedGroup =
			new TestCaseGroup(testCtx, "delete_used", "Delete current program");
		group.addChild(delUsedGroup);

		delUsedGroup->addChild(
			new LifeTest("program", "program", types.getProgramType(),
						 &LifeTest::testDeleteUsed));
	}

	{
		TestCaseGroup* const	attGroup	= new TestCaseGroup(
			testCtx, "attach", "Attachment tests");
		group.addChild(attGroup);

		{
			TestCaseGroup* const	nameGroup	= new TestCaseGroup(
				testCtx, "deleted_name", "Name of deleted attachment");
			attGroup->addChild(nameGroup);

			const vector<Attacher*>& atts = types.getAttachers();
			for (vector<Attacher*>::const_iterator it = atts.begin(); it != atts.end(); ++it)
			{
				const string name = attacherName(**it);
				nameGroup->addChild(new AttachmentTest(name.c_str(), name.c_str(), **it,
													   &AttachmentTest::testDeletedNames));
			}
		}
		{
			TestCaseGroup* inputGroup = new TestCaseGroup(
				testCtx, "deleted_input", "Input from deleted attachment");
			attGroup->addChild(inputGroup);

			const vector<InputAttacher*>& inAtts = types.getInputAttachers();
			for (vector<InputAttacher*>::const_iterator it = inAtts.begin();
				 it != inAtts.end(); ++it)
			{
				const string name = attacherName((*it)->getAttacher());
				inputGroup->addChild(new InputAttachmentTest(name.c_str(), name.c_str(), **it));
			}
		}
		{
			TestCaseGroup* outputGroup = new TestCaseGroup(
				testCtx, "deleted_output", "Output to deleted attachment");
			attGroup->addChild(outputGroup);

			const vector<OutputAttacher*>& outAtts = types.getOutputAttachers();
			for (vector<OutputAttacher*>::const_iterator it = outAtts.begin();
				 it != outAtts.end(); ++it)
			{
				string name = attacherName((*it)->getAttacher());
				outputGroup->addChild(new OutputAttachmentTest(name.c_str(), name.c_str(),
															   **it));
			}
		}
	}
}